

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

int fmt::v6::internal::
    parse_nonnegative_int<wchar_t,fmt::v6::internal::id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>>,wchar_t,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>>,wchar_t>>&,wchar_t>&>
              (wchar_t **begin,wchar_t *end,
              id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
              *eh)

{
  long in_RSI;
  long *in_RDI;
  uint big;
  uint max_int;
  uint value;
  char *in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffd0;
  uint uVar1;
  undefined4 local_24;
  undefined4 local_4;
  
  if (*(int *)*in_RDI == 0x30) {
    *in_RDI = *in_RDI + 4;
    local_4 = 0;
  }
  else {
    local_24 = 0;
    do {
      if (0xccccccc < local_24) {
        local_24 = 0x80000000;
        uVar1 = in_stack_ffffffffffffffd0;
        break;
      }
      local_24 = local_24 * 10 + *(int *)*in_RDI + -0x30;
      *in_RDI = *in_RDI + 4;
      uVar1 = in_stack_ffffffffffffffd0 & 0xffffff;
      if ((*in_RDI != in_RSI) &&
         (uVar1 = in_stack_ffffffffffffffd0 & 0xffffff, 0x2f < *(int *)*in_RDI)) {
        uVar1 = CONCAT13(*(int *)*in_RDI < 0x3a,(int3)in_stack_ffffffffffffffd0);
      }
      in_stack_ffffffffffffffd0 = uVar1;
    } while ((char)(uVar1 >> 0x18) != '\0');
    if (0x7fffffff < local_24) {
      id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
      ::on_error((id_adapter<fmt::v6::format_handler<fmt::v6::arg_formatter<fmt::v6::buffer_range<wchar_t>_>,_wchar_t,_fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<wchar_t>_>,_wchar_t>_>_&,_wchar_t>
                  *)CONCAT44(0xccccccc,uVar1),in_stack_ffffffffffffffc8);
    }
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

FMT_CONSTEXPR int parse_nonnegative_int(const Char*& begin, const Char* end,
                                        ErrorHandler&& eh) {
  FMT_ASSERT(begin != end && '0' <= *begin && *begin <= '9', "");
  if (*begin == '0') {
    ++begin;
    return 0;
  }
  unsigned value = 0;
  // Convert to unsigned to prevent a warning.
  constexpr unsigned max_int = max_value<int>();
  unsigned big = max_int / 10;
  do {
    // Check for overflow.
    if (value > big) {
      value = max_int + 1;
      break;
    }
    value = value * 10 + unsigned(*begin - '0');
    ++begin;
  } while (begin != end && '0' <= *begin && *begin <= '9');
  if (value > max_int) eh.on_error("number is too big");
  return static_cast<int>(value);
}